

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_layer_t.h
# Opt level: O0

void __thiscall relu_layer_t::calc_grads(relu_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float *pfVar1;
  long in_RDI;
  int z;
  int j;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x44); local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x48); local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x4c); local_1c = local_1c + 1) {
        pfVar1 = tensor_t<float>::operator()
                           ((tensor_t<float> *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
        if (0.0 <= *pfVar1) {
          pfVar1 = tensor_t<float>::operator()
                             ((tensor_t<float> *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
          in_stack_ffffffffffffffd0 = *pfVar1 * 1.0;
        }
        else {
          in_stack_ffffffffffffffd0 = 0.0;
        }
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd0;
        pfVar1 = tensor_t<float>::operator()
                           ((tensor_t<float> *)
                            CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
        *pfVar1 = in_stack_ffffffffffffffd0;
      }
    }
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    for (int i = 0; i < in.size.x; i++)
      for (int j = 0; j < in.size.y; j++)
        for (int z = 0; z < in.size.z; z++) {
          grads_in(i, j, z) = (in(i, j, z) < 0) ?
                              (0) :
                              (1 * grad_next_layer(i, j, z));
        }
  }